

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O2

void __thiscall
xLearn::DMatrix::Compress
          (DMatrix *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *feature_list)

{
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  pointer puVar2;
  long lVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  pointer ppvVar6;
  size_t __n;
  index_t i_1;
  index_t i;
  ulong uVar7;
  mapped_type mVar8;
  long lVar9;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  feat_set;
  feature_map mp;
  
  __n = 0;
  for (ppvVar6 = (this->row).
                 super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppvVar6 !=
      (this->row).
      super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish; ppvVar6 = ppvVar6 + 1) {
    __n = __n + (*(long *)(*ppvVar6 + 8) - *(long *)*ppvVar6) / 0xc;
  }
  feat_set._M_h._M_buckets = &feat_set._M_h._M_single_bucket;
  feat_set._M_h._M_bucket_count = 1;
  feat_set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  feat_set._M_h._M_element_count = 0;
  feat_set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  feat_set._M_h._M_rehash_policy._M_next_resize = 0;
  feat_set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_std::integral_constant<bool,_true>_>
             *)&feat_set,__n);
  for (uVar7 = 0; uVar7 < this->row_length; uVar7 = uVar7 + 1) {
    pvVar1 = (this->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
    for (lVar9 = *(long *)pvVar1; lVar9 != *(long *)(pvVar1 + 8); lVar9 = lVar9 + 0xc) {
      sVar4 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&feat_set._M_h,(key_type *)(lVar9 + 4));
      if (sVar4 == 0) {
        std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)&feat_set._M_h,(key_type *)(lVar9 + 4));
      }
    }
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (feature_list,feat_set._M_h._M_element_count);
  std::__copy_move<false,false,std::forward_iterator_tag>::
  __copy_m<std::__detail::_Node_iterator<unsigned_int,true,false>,std::back_insert_iterator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
            ((_Node_iterator<unsigned_int,_true,_false>)feat_set._M_h._M_before_begin._M_nxt,
             (_Node_iterator<unsigned_int,_true,_false>)0x0,
             (back_insert_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>)
             feature_list);
  std::
  __sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start,
             (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_finish);
  mp._M_h._M_buckets = &mp._M_h._M_single_bucket;
  mp._M_h._M_bucket_count = 1;
  mp._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  mp._M_h._M_element_count = 0;
  mp._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  mp._M_h._M_rehash_policy._M_next_resize = 0;
  mp._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&mp,(long)(feature_list->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)(feature_list->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start >> 2);
  mVar8 = 1;
  while( true ) {
    puVar2 = (feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
             .super__Vector_impl_data._M_start;
    if ((ulong)((long)(feature_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <=
        (ulong)(mVar8 - 1)) break;
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&mp,puVar2 + (mVar8 - 1));
    *pmVar5 = mVar8;
    mVar8 = mVar8 + 1;
  }
  for (uVar7 = 0; uVar7 < this->row_length; uVar7 = uVar7 + 1) {
    pvVar1 = (this->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7];
    lVar3 = *(long *)(pvVar1 + 8);
    for (lVar9 = *(long *)pvVar1; lVar9 != lVar3; lVar9 = lVar9 + 0xc) {
      pmVar5 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&mp,(key_type *)(lVar9 + 4));
      *(key_type *)(lVar9 + 4) = *pmVar5;
    }
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&mp._M_h);
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&feat_set._M_h);
  return;
}

Assistant:

void Compress(std::vector<index_t>& feature_list) {
    // Using a map to store the mapping relations
    size_t node_num {0};
    for (auto row : this->row) {
      node_num += row->size();
    }
    std::unordered_set<index_t> feat_set;
    feat_set.reserve(node_num);
    for (index_t i = 0; i < this->row_length; ++i) {
      SparseRow* row = this->row[i];
      for (SparseRow::iterator iter = row->begin();
           iter != row->end(); ++iter) {
        if (feat_set.count(iter->feat_id) == 0) {
          feat_set.insert(iter->feat_id);
        }
      }
    }
    feature_list.reserve(feat_set.size());
    std::copy(feat_set.begin(), feat_set.end(), 
              std::back_inserter(feature_list));
    std::sort(begin(feature_list), end(feature_list));
    feature_map mp;
    mp.reserve(feature_list.size());
    for (index_t i = 0; i < feature_list.size(); ++ i) {
      mp[feature_list[i]] = i + 1;
    }
    for (index_t i = 0; i < this->row_length; ++ i) {
      for (auto &iter: *this->row[i]) {
        // using map is better than lower_bound
        iter.feat_id = mp[iter.feat_id];
      }
    }
  }